

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmstrbuf.cpp
# Opt level: O1

int __thiscall
CVmObjStringBuffer::compare_to(CVmObjStringBuffer *this,vm_obj_id_t self,vm_val_t *val)

{
  int iVar1;
  int *piVar2;
  int *piVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  char *str;
  int iVar9;
  long lVar10;
  int iVar11;
  
  if ((val->typ != VM_OBJ) ||
     (iVar6 = (**(code **)(*(long *)&G_obj_table_X.pages_[(val->val).obj >> 0xc]
                                     [(val->val).obj & 0xfff].ptr_ + 8))
                        (G_obj_table_X.pages_[(val->val).obj >> 0xc] + ((val->val).obj & 0xfff),
                         metaclass_reg_), iVar6 == 0)) {
    str = vm_val_t::get_as_string(val);
    if (str == (char *)0x0) {
      err_throw(0x7d9);
    }
    iVar6 = compare_str(this,str);
    return iVar6;
  }
  uVar7 = (val->val).obj & 0xfff;
  piVar2 = (int *)(this->super_CVmObject).ext_;
  iVar6 = *piVar2;
  iVar8 = uVar7 * 3;
  piVar3 = *(int **)((long)&G_obj_table_X.pages_[(val->val).obj >> 0xc][uVar7].ptr_ + 8);
  iVar1 = *piVar3;
  iVar5 = iVar1;
  if (iVar6 < iVar1) {
    iVar5 = iVar6;
  }
  bVar4 = iVar5 < 1;
  if (0 < iVar5) {
    iVar11 = piVar2[3];
    iVar9 = piVar3[3];
    iVar8 = -1;
    if (iVar9 <= iVar11) {
      lVar10 = 0;
      do {
        if (iVar9 < iVar11) {
          iVar8 = 1;
          break;
        }
        bVar4 = iVar5 <= (int)lVar10 + 1;
        if (iVar5 + -1 == (int)lVar10) break;
        iVar11 = piVar2[lVar10 + 4];
        iVar9 = piVar3[lVar10 + 4];
        lVar10 = lVar10 + 1;
      } while (iVar9 <= iVar11);
    }
  }
  if (bVar4) {
    iVar8 = iVar6 - iVar1;
  }
  return iVar8;
}

Assistant:

int CVmObjStringBuffer::compare_to(VMG_ vm_obj_id_t self,
                                   const vm_val_t *val) const
{
    /* 
     *   we can compare our contents to another string buffer, or to a
     *   regular string object 
     */
    const char *str;
    if (val->typ == VM_OBJ && is_string_buffer_obj(vmg_ val->val.obj))
    {
        /* compare the buffers character by character */
        CVmObjStringBuffer *other =
            (CVmObjStringBuffer *)vm_objp(vmg_ val->val.obj);
        int32_t len1 = get_ext()->len, len2 = other->get_ext()->len;
        const wchar_t *buf1 = get_ext()->buf, *buf2 = other->get_ext()->buf;
        for (int32_t i = 0 ; i < len1 && i < len2 ; ++i, ++buf1, ++buf2)
        {
            if (*buf1 < *buf2)
                return -1;
            else if (*buf1 > *buf2)
                return 1;
        }

        /* 
         *   They're equal up to the full length of the shorter string.  If
         *   we ran out of strings at the same time, they're equal; otherwise
         *   the longer string compares greater 
         */
        return len1 - len2;
    }
    else if ((str = val->get_as_string(vmg0_)) != 0)
    {
        /* compare to a constant string */
        return compare_str(str);
    }
    else
    {
        /* the other value isn't comparable to string */
        err_throw(VMERR_INVALID_COMPARISON);
        AFTER_ERR_THROW(return 0;)
    }
}